

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
initialize(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int num_keys,double density)

{
  undefined1 auVar1 [16];
  int *piVar2;
  undefined8 uVar3;
  size_t __n;
  unsigned_long *__s;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  undefined1 *puVar6;
  size_type in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uVar7;
  undefined1 local_36 [22];
  int local_20;
  int local_1c [7];
  
  *(int *)(in_RDI + 0x5c) = in_ESI;
  local_1c[0] = (int)((double)in_ESI / in_XMM0_Qa);
  local_20 = in_ESI + 1;
  piVar2 = std::max<int>(local_1c,&local_20);
  *(int *)(in_RDI + 0x58) = *piVar2;
  auVar4._0_8_ = (double)*(int *)(in_RDI + 0x58);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = auVar4._0_8_ * 0.015625;
  auVar1 = vroundsd_avx(auVar4,auVar5,10);
  uVar3 = vcvttsd2usi_avx512f(auVar1);
  *(int *)(in_RDI + 0x68) = (int)uVar3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*(int *)(in_RDI + 0x68);
  __n = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    __n = 0xffffffffffffffff;
  }
  bitmap_allocator(in_stack_ffffffffffffff78);
  __s = __gnu_cxx::new_allocator<unsigned_long>::allocate
                  ((new_allocator<unsigned_long> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  uVar7 = 0;
  memset(__s,0,__n);
  *(unsigned_long **)(in_RDI + 0x60) = __s;
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x13ad3e);
  key_allocator(in_stack_ffffffffffffff78);
  piVar2 = __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)CONCAT44(uVar7,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  *(int **)(in_RDI + 0x48) = piVar2;
  std::allocator<int>::~allocator((allocator<int> *)0x13ad8a);
  puVar6 = local_36;
  payload_allocator(in_stack_ffffffffffffff78);
  piVar2 = __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)CONCAT44(uVar7,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88,puVar6);
  *(int **)(in_RDI + 0x50) = piVar2;
  std::allocator<int>::~allocator((allocator<int> *)0x13add4);
  return;
}

Assistant:

void initialize(int num_keys, double density) {
    num_keys_ = num_keys;
    data_capacity_ =
        std::max(static_cast<int>(num_keys / density), num_keys + 1);
    bitmap_size_ = static_cast<size_t>(std::ceil(data_capacity_ / 64.));
    bitmap_ = new (bitmap_allocator().allocate(bitmap_size_))
        uint64_t[bitmap_size_]();  // initialize to all false
#if ALEX_DATA_NODE_SEP_ARRAYS
    key_slots_ =
        new (key_allocator().allocate(data_capacity_)) T[data_capacity_];
    payload_slots_ =
        new (payload_allocator().allocate(data_capacity_)) P[data_capacity_];
#else
    data_slots_ =
        new (value_allocator().allocate(data_capacity_)) V[data_capacity];
#endif
  }